

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qflickgesture.cpp
# Opt level: O0

bool __thiscall
PressDelayHandler::released
          (PressDelayHandler *this,QEvent *e,bool scrollerWasActive,bool scrollerIsActive)

{
  bool bVar1;
  bool bVar2;
  QMouseEvent *p;
  byte in_CL;
  byte in_DL;
  long in_RDI;
  long in_FS_OFFSET;
  bool result;
  QScopedPointer<QMouseEvent,_QScopedPointerDeleter<QMouseEvent>_> releaseEvent;
  QWidget *in_stack_ffffffffffffff48;
  QScopedPointer<QMouseEvent,_QScopedPointerDeleter<QMouseEvent>_> *in_stack_ffffffffffffff50;
  QPointer<QWidget> *this_00;
  undefined7 in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff5f;
  bool local_94;
  bool local_93;
  int in_stack_ffffffffffffffa4;
  QMouseEvent *in_stack_ffffffffffffffa8;
  PressDelayHandler *in_stack_ffffffffffffffb0;
  QEvent *in_stack_ffffffffffffffb8;
  QScopedPointer<QMouseEvent,_QScopedPointerDeleter<QMouseEvent>_> local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = (bool)(in_CL & 1);
  local_94 = true;
  if ((in_DL & 1) == 0) {
    local_94 = bVar1;
  }
  local_93 = local_94;
  bVar2 = QBasicTimer::isActive((QBasicTimer *)(in_RDI + 0x10));
  if (bVar2) {
    QBasicTimer::stop();
  }
  bVar2 = QScopedPointer::operator_cast_to_bool
                    ((QScopedPointer<QMouseEvent,_QScopedPointerDeleter<QMouseEvent>_> *)0xa7f3b0);
  if (((bVar2) && (bVar2 = ::QPointer::operator_cast_to_bool((QPointer<QWidget> *)0xa7f3c7), bVar2))
     && (bVar1 == false)) {
    local_10.d = (QMouseEvent *)&DAT_aaaaaaaaaaaaaaaa;
    p = copyMouseEvent(in_stack_ffffffffffffffb8);
    QScopedPointer<QMouseEvent,_QScopedPointerDeleter<QMouseEvent>_>::QScopedPointer(&local_10,p);
    QScopedPointer<QMouseEvent,_QScopedPointerDeleter<QMouseEvent>_>::data
              ((QScopedPointer<QMouseEvent,_QScopedPointerDeleter<QMouseEvent>_> *)(in_RDI + 0x18));
    sendMouseEvent(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4);
    QScopedPointer<QMouseEvent,_QScopedPointerDeleter<QMouseEvent>_>::data(&local_10);
    sendMouseEvent(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4);
    local_93 = true;
    QScopedPointer<QMouseEvent,_QScopedPointerDeleter<QMouseEvent>_>::~QScopedPointer
              (in_stack_ffffffffffffff50);
  }
  else {
    bVar2 = ::QPointer::operator_cast_to_bool((QPointer<QWidget> *)0xa7f596);
    if ((bVar2) && (bVar1 != false)) {
      sendMouseEvent(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4);
    }
  }
  this_00 = (QPointer<QWidget> *)0x0;
  QScopedPointer<QMouseEvent,_QScopedPointerDeleter<QMouseEvent>_>::reset
            ((QScopedPointer<QMouseEvent,_QScopedPointerDeleter<QMouseEvent>_> *)0x0,
             (QMouseEvent *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
  QPointer<QWidget>::operator=(this_00,in_stack_ffffffffffffff48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_93;
  }
  __stack_chk_fail();
}

Assistant:

bool released(QEvent *e, bool scrollerWasActive, bool scrollerIsActive)
    {
        // consume this event if the scroller was or is active
        bool result = scrollerWasActive || scrollerIsActive;

        // stop the timer
        if (pressDelayTimer.isActive())
            pressDelayTimer.stop();

        // we still haven't even sent the press, so do it now
        if (pressDelayEvent && mouseTarget && !scrollerIsActive) {
            QScopedPointer<QMouseEvent> releaseEvent(copyMouseEvent(e));

            qFGDebug() << "QFG: re-sending mouse press (due to release) for " << mouseTarget;
            sendMouseEvent(pressDelayEvent.data(), UngrabMouseBefore);

            qFGDebug() << "QFG: faking mouse release (due to release) for " << mouseTarget;
            sendMouseEvent(releaseEvent.data());

            result = true; // consume this event
        } else if (mouseTarget && scrollerIsActive) {
            // we grabbed the mouse explicitly when the scroller became active, so undo that now
            sendMouseEvent(nullptr, UngrabMouseBefore);
        }
        pressDelayEvent.reset(nullptr);
        mouseTarget = nullptr;
        return result;
    }